

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TreePatterns.cpp
# Opt level: O1

bool __thiscall
IRT::MoveFromMemByRegToMemByReg::TryToGenerateCode
          (MoveFromMemByRegToMemByReg *this,INode *tree,CTemp *dest,ChildrenTemps *children,
          AssemblyCommands *commands)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  CMoveStatement *this_00;
  CExpression *pCVar2;
  CMemExpression *this_01;
  CMemExpression *this_02;
  CTempExpression *this_03;
  CTempExpression *this_04;
  INode *pIVar3;
  CTemp rightRegister;
  CTemp leftRegister;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_c8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b8;
  INode *local_a8;
  pair<IRT::CTemp,_const_IRT::INode_*> local_a0;
  vector<std::shared_ptr<AssemblyCode::AssemblyCommand>,std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>>>
  *local_78;
  CTemp local_70;
  CTemp local_50;
  
  if (tree == (INode *)0x0) {
    this_00 = (CMoveStatement *)0x0;
  }
  else {
    this_00 = (CMoveStatement *)__dynamic_cast(tree,&INode::typeinfo,&CMoveStatement::typeinfo,0);
  }
  if (this_00 != (CMoveStatement *)0x0) {
    pCVar2 = CMoveStatement::Target(this_00);
    if (pCVar2 == (CExpression *)0x0) {
      this_01 = (CMemExpression *)0x0;
    }
    else {
      this_01 = (CMemExpression *)
                __dynamic_cast(pCVar2,&CExpression::typeinfo,&CMemExpression::typeinfo,0);
    }
    pCVar2 = CMoveStatement::Source(this_00);
    if (pCVar2 == (CExpression *)0x0) {
      this_02 = (CMemExpression *)0x0;
    }
    else {
      this_02 = (CMemExpression *)
                __dynamic_cast(pCVar2,&CExpression::typeinfo,&CMemExpression::typeinfo,0);
    }
    if (this_02 != (CMemExpression *)0x0 && this_01 != (CMemExpression *)0x0) {
      pCVar2 = CMemExpression::getAddress(this_01);
      if (pCVar2 == (CExpression *)0x0) {
        this_03 = (CTempExpression *)0x0;
      }
      else {
        this_03 = (CTempExpression *)
                  __dynamic_cast(pCVar2,&CExpression::typeinfo,&CTempExpression::typeinfo,0);
      }
      pCVar2 = CMemExpression::getAddress(this_02);
      if (pCVar2 == (CExpression *)0x0) {
        this_04 = (CTempExpression *)0x0;
      }
      else {
        this_04 = (CTempExpression *)
                  __dynamic_cast(pCVar2,&CExpression::typeinfo,&CTempExpression::typeinfo,0);
      }
      CTemp::CTemp(&local_50);
      CTemp::CTemp(&local_70);
      if (this_03 == (CTempExpression *)0x0) {
        local_78 = (vector<std::shared_ptr<AssemblyCode::AssemblyCommand>,std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>>>
                    *)commands;
        pIVar3 = (INode *)CMemExpression::getAddress(this_01);
        local_c8 = &local_b8;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_c8,local_50.name._M_dataplus._M_p,
                   local_50.name._M_dataplus._M_p + local_50.name._M_string_length);
        paVar1 = &local_a0.first.name.field_2;
        if (local_c8 == &local_b8) {
          local_a0.first.name.field_2._8_8_ = local_b8._8_8_;
          local_a0.first.name._M_dataplus._M_p = (pointer)paVar1;
        }
        else {
          local_a0.first.name._M_dataplus._M_p = (pointer)local_c8;
        }
        local_a0.first.name.field_2._M_allocated_capacity._1_7_ =
             local_b8._M_allocated_capacity._1_7_;
        local_a0.first.name.field_2._M_local_buf[0] = local_b8._M_local_buf[0];
        local_a0.first.name._M_string_length = (size_type)local_c0;
        local_c0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_b8._M_local_buf[0] = '\0';
        local_c8 = &local_b8;
        local_a8 = pIVar3;
        local_a0.second = pIVar3;
        std::
        vector<std::pair<IRT::CTemp,IRT::INode_const*>,std::allocator<std::pair<IRT::CTemp,IRT::INode_const*>>>
        ::emplace_back<std::pair<IRT::CTemp,IRT::INode_const*>>
                  ((vector<std::pair<IRT::CTemp,IRT::INode_const*>,std::allocator<std::pair<IRT::CTemp,IRT::INode_const*>>>
                    *)children,&local_a0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a0.first.name._M_dataplus._M_p != paVar1) {
          operator_delete(local_a0.first.name._M_dataplus._M_p);
        }
        commands = (AssemblyCommands *)local_78;
        if (local_c8 != &local_b8) {
          operator_delete(local_c8);
        }
      }
      else {
        CTempExpression::getTemprorary(this_03);
        std::__cxx11::string::_M_assign((string *)&local_50);
      }
      if (this_04 == (CTempExpression *)0x0) {
        pIVar3 = (INode *)CMemExpression::getAddress(this_02);
        local_c8 = &local_b8;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_c8,local_70.name._M_dataplus._M_p,
                   local_70.name._M_dataplus._M_p + local_70.name._M_string_length);
        paVar1 = &local_a0.first.name.field_2;
        if (local_c8 == &local_b8) {
          local_a0.first.name.field_2._8_8_ = local_b8._8_8_;
          local_a0.first.name._M_dataplus._M_p = (pointer)paVar1;
        }
        else {
          local_a0.first.name._M_dataplus._M_p = (pointer)local_c8;
        }
        local_a0.first.name.field_2._M_allocated_capacity._1_7_ =
             local_b8._M_allocated_capacity._1_7_;
        local_a0.first.name.field_2._M_local_buf[0] = local_b8._M_local_buf[0];
        local_a0.first.name._M_string_length = (size_type)local_c0;
        local_c0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_b8._M_local_buf[0] = '\0';
        local_c8 = &local_b8;
        local_a8 = pIVar3;
        local_a0.second = pIVar3;
        std::
        vector<std::pair<IRT::CTemp,IRT::INode_const*>,std::allocator<std::pair<IRT::CTemp,IRT::INode_const*>>>
        ::emplace_back<std::pair<IRT::CTemp,IRT::INode_const*>>
                  ((vector<std::pair<IRT::CTemp,IRT::INode_const*>,std::allocator<std::pair<IRT::CTemp,IRT::INode_const*>>>
                    *)children,&local_a0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a0.first.name._M_dataplus._M_p != paVar1) {
          operator_delete(local_a0.first.name._M_dataplus._M_p);
        }
        if (local_c8 != &local_b8) {
          operator_delete(local_c8);
        }
      }
      else {
        CTempExpression::getTemprorary(this_04);
        std::__cxx11::string::_M_assign((string *)&local_70);
      }
      local_a0.first.name._M_dataplus._M_p = (pointer)0x0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<AssemblyCode::MoveRegFromMemToMemByReg,std::allocator<AssemblyCode::MoveRegFromMemToMemByReg>,IRT::CTemp&,IRT::CTemp&>
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_a0.first.name._M_string_length
                 ,(MoveRegFromMemToMemByReg **)&local_a0,
                 (allocator<AssemblyCode::MoveRegFromMemToMemByReg> *)&local_c8,&local_50,&local_70)
      ;
      std::
      vector<std::shared_ptr<AssemblyCode::AssemblyCommand>,std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>>>
      ::emplace_back<std::shared_ptr<AssemblyCode::MoveRegFromMemToMemByReg>>
                ((vector<std::shared_ptr<AssemblyCode::AssemblyCommand>,std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>>>
                  *)commands,(shared_ptr<AssemblyCode::MoveRegFromMemToMemByReg> *)&local_a0);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a0.first.name._M_string_length !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   local_a0.first.name._M_string_length);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70.name._M_dataplus._M_p != &local_70.name.field_2) {
        operator_delete(local_70.name._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50.name._M_dataplus._M_p != &local_50.name.field_2) {
        operator_delete(local_50.name._M_dataplus._M_p);
      }
      return true;
    }
  }
  return false;
}

Assistant:

bool IRT::MoveFromMemByRegToMemByReg::TryToGenerateCode( const IRT::INode *tree, const IRT::CTemp &dest,
                                                         ChildrenTemps &children, AssemblyCommands &commands ) {
    ConstMovePtr movePtr = dynamic_cast<ConstMovePtr>(tree);
    if ( movePtr ) {
        ConstMemPtr leftMemPtr = dynamic_cast<ConstMemPtr>(movePtr->Target( ));
        ConstMemPtr rightMemPtr = dynamic_cast<ConstMemPtr>(movePtr->Source( ));
        if ( leftMemPtr && rightMemPtr ) {
            ConstTempPtr targetRegPtr = dynamic_cast<ConstTempPtr>(leftMemPtr->getAddress( ));
            ConstTempPtr sourceRegPtr = dynamic_cast<ConstTempPtr>(rightMemPtr->getAddress( ));
            CTemp leftRegister;
            CTemp rightRegister;
            if ( !targetRegPtr ) {
                children.push_back( std::make_pair( leftRegister, leftMemPtr->getAddress( )));
            } else {
                leftRegister = targetRegPtr->getTemprorary( );
            }
            if ( !sourceRegPtr ) {
                children.push_back( std::make_pair( rightRegister, rightMemPtr->getAddress( )));
            } else {
                rightRegister = sourceRegPtr->getTemprorary( );
            }
            commands.emplace_back( std::make_shared<AssemblyCode::MoveRegFromMemToMemByReg>( leftRegister,
                                                                                             rightRegister ));
            return true;
        }
    }
    return false;
}